

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage2DEmptyTexCase::createTexture(TexSubImage2DEmptyTexCase *this)

{
  deUint32 type;
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  char *str;
  void *data_00;
  PixelBufferAccess local_e8;
  PixelBufferAccess local_c0;
  undefined1 local_94 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_50 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  TexSubImage2DEmptyTexCase *this_local;
  
  data.m_data.m_cap._4_4_ = 0;
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&rnd.m_rnd.z,&(this->super_Texture2DSpecCase).m_texFormat);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_50,dVar1);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&data.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             data.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < (this->super_Texture2DSpecCase).m_numLevels; levelH = levelH + 1) {
    iVar2 = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH & 0x1f));
    iVar3 = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH & 0x1f));
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               levelH,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,iVar2,iVar3,0,
               this->m_format,this->m_dataType,(void *)0x0);
  }
  for (levelH_1 = 0; levelH_1 < (this->super_Texture2DSpecCase).m_numLevels; levelH_1 = levelH_1 + 1
      ) {
    iVar2 = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    iVar3 = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)local_50,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_94,(Random *)local_50,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,iVar2,iVar3,1);
    tcu::TextureLevel::getAccess(&local_c0,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithComponentGradients(&local_c0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_94);
    dVar1 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_e8,(TextureLevel *)&rnd.m_rnd.z);
    data_00 = tcu::PixelBufferAccess::getDataPtr(&local_e8);
    sglr::ContextWrapper::glTexSubImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               levelH_1,0,0,iVar2,iVar3,dVar1,type,data_00);
  }
  de::Random::~Random((Random *)local_50);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First allocate storage for each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify pixel data to all levels using glTexSubImage2D()
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}